

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<_FcPattern_*>::resize_internal(QList<_FcPattern_*> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<_FcPattern_*> *this_00;
  __off_t __length;
  QArrayDataPointer<_FcPattern_*> *in_RSI;
  QArrayDataPointer<_FcPattern_*> *in_RDI;
  QArrayDataPointer<_FcPattern_*> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<_FcPattern_*> *this_01;
  QArrayDataPointer<_FcPattern_*> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<_FcPattern_*> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<_FcPattern_*> *__file;
  
  QArrayDataPointer<_FcPattern_*>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<_FcPattern_*>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<_FcPattern_*> *)capacity((QList<_FcPattern_*> *)0xa7fee1);
    qVar2 = QArrayDataPointer<_FcPattern_*>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<_FcPattern_*> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<_FcPattern_*> *)QArrayDataPointer<_FcPattern_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<_FcPattern_*>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<_FcPattern_*>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (_FcPattern ***)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}